

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void fclose_on_exec(mg_file_access *filep,mg_connection *conn)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint in_ECX;
  char *func;
  
  if ((filep != (mg_file_access *)0x0) && ((FILE *)filep->fp != (FILE *)0x0)) {
    iVar1 = fileno((FILE *)filep->fp);
    iVar1 = fcntl64(iVar1,2,1);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,func,in_ECX,"%s: fcntl(F_SETFD FD_CLOEXEC) failed: %s",
                 "fclose_on_exec",pcVar3);
    }
  }
  return;
}

Assistant:

static void
fclose_on_exec(struct mg_file_access *filep, struct mg_connection *conn)
{
	if (filep != NULL && filep->fp != NULL) {
#if defined(_WIN32)
		(void)conn; /* Unused. */
#else
		if (fcntl(fileno(filep->fp), F_SETFD, FD_CLOEXEC) != 0) {
			mg_cry_internal(conn,
			                "%s: fcntl(F_SETFD FD_CLOEXEC) failed: %s",
			                __func__,
			                strerror(ERRNO));
		}
#endif
	}
}